

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

void __thiscall
MovDemuxer::getTrackList
          (MovDemuxer *this,
          map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
          *trackList)

{
  Track *pTVar1;
  int trackType;
  map<int,TrackInfo,std::less<int>,std::allocator<std::pair<int_const,TrackInfo>>> *this_00;
  TrackInfo local_90;
  int local_5c;
  pair<int,_TrackInfo> local_58;
  int local_1c;
  map<int,TrackInfo,std::less<int>,std::allocator<std::pair<int_const,TrackInfo>>> *pmStack_18;
  int i;
  map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
  *trackList_local;
  MovDemuxer *this_local;
  
  pmStack_18 = (map<int,TrackInfo,std::less<int>,std::allocator<std::pair<int_const,TrackInfo>>> *)
               trackList;
  trackList_local =
       (map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_> *)
       this;
  for (local_1c = 0; this_00 = pmStack_18, local_1c < (this->super_IOContextDemuxer).num_tracks;
      local_1c = local_1c + 1) {
    if ((this->super_IOContextDemuxer).tracks[local_1c]->type != CONTROL) {
      local_5c = local_1c + 1;
      pTVar1 = (this->super_IOContextDemuxer).tracks[local_1c];
      trackType = 0;
      if (pTVar1->type == SUBTITLE) {
        trackType = 400;
      }
      TrackInfo::TrackInfo(&local_90,trackType,pTVar1->language,0);
      std::make_pair<int,TrackInfo>(&local_58,&local_5c,&local_90);
      std::map<int,TrackInfo,std::less<int>,std::allocator<std::pair<int_const,TrackInfo>>>::
      insert<std::pair<int,TrackInfo>>(this_00,&local_58);
      std::pair<int,_TrackInfo>::~pair(&local_58);
      TrackInfo::~TrackInfo(&local_90);
    }
  }
  return;
}

Assistant:

void MovDemuxer::getTrackList(std::map<int32_t, TrackInfo>& trackList)
{
    for (int i = 0; i < num_tracks; i++)
    {
        if (tracks[i]->type != IOContextTrackType::CONTROL)
            trackList.insert(
                std::make_pair(i + 1, TrackInfo(tracks[i]->type == IOContextTrackType::SUBTITLE ? TRACKTYPE_SRT : 0,
                                                tracks[i]->language, 0)));
    }
}